

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O1

bool commandLineSolverOk(HighsLogOptions *report_log_options,string *value)

{
  size_t __n;
  int iVar1;
  
  __n = value->_M_string_length;
  if (__n == kSimplexString_abi_cxx11_._M_string_length) {
    if (__n == 0) {
      return true;
    }
    iVar1 = bcmp((value->_M_dataplus)._M_p,kSimplexString_abi_cxx11_._M_dataplus._M_p,__n);
    if (iVar1 == 0) {
      return true;
    }
  }
  if (__n == kHighsChooseString_abi_cxx11_._M_string_length) {
    if (__n == 0) {
      return true;
    }
    iVar1 = bcmp((value->_M_dataplus)._M_p,kHighsChooseString_abi_cxx11_._M_dataplus._M_p,__n);
    if (iVar1 == 0) {
      return true;
    }
  }
  if (__n == kIpmString_abi_cxx11_._M_string_length) {
    if (__n == 0) {
      return true;
    }
    iVar1 = bcmp((value->_M_dataplus)._M_p,kIpmString_abi_cxx11_._M_dataplus._M_p,__n);
    if (iVar1 == 0) {
      return true;
    }
  }
  if (__n == kPdlpString_abi_cxx11_._M_string_length) {
    if (__n == 0) {
      return true;
    }
    iVar1 = bcmp((value->_M_dataplus)._M_p,kPdlpString_abi_cxx11_._M_dataplus._M_p,__n);
    if (iVar1 == 0) {
      return true;
    }
  }
  highsLogUser(report_log_options,kWarning,
               "Value \"%s\" for solver option is not one of \"%s\", \"%s\", \"%s\" or \"%s\"\n",
               (value->_M_dataplus)._M_p,kSimplexString_abi_cxx11_._M_dataplus._M_p,
               kHighsChooseString_abi_cxx11_._M_dataplus._M_p,kIpmString_abi_cxx11_._M_dataplus._M_p
               ,kPdlpString_abi_cxx11_._M_dataplus._M_p);
  return false;
}

Assistant:

bool commandLineSolverOk(const HighsLogOptions& report_log_options,
                         const string& value) {
  if (value == kSimplexString || value == kHighsChooseString ||
      value == kIpmString || value == kPdlpString)
    return true;
  highsLogUser(report_log_options, HighsLogType::kWarning,
               "Value \"%s\" for solver option is not one of \"%s\", \"%s\", "
               "\"%s\" or \"%s\"\n",
               value.c_str(), kSimplexString.c_str(),
               kHighsChooseString.c_str(), kIpmString.c_str(),
               kPdlpString.c_str());
  return false;
}